

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O3

void Mpm_ManPerformRound(Mpm_Man_t *p)

{
  void *pvVar1;
  int *piVar2;
  int *piVar3;
  void **ppvVar4;
  Mpm_LibLut_t *pMVar5;
  Mpm_Par_t *pMVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int *piVar9;
  Mpm_Cut_t *pMVar10;
  Mig_Man_t *pMVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  Mig_Obj_t *pMVar21;
  Mig_Obj_t *pMVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  timespec ts;
  
  iVar8 = clock_gettime(3,(timespec *)&ts);
  if (iVar8 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  pMVar11 = p->pMig;
  if ((p->vMigRefs).nSize != (pMVar11->vRefs).nSize) {
    __assert_fail("Vec_IntSize(&p->vMigRefs) == Vec_IntSize(&p->pMig->vRefs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                  ,0x32d,"void Mpm_ManPerformRound(Mpm_Man_t *)");
  }
  memcpy((p->vMigRefs).pArray,(pMVar11->vRefs).pArray,(long)pMVar11->nObjs << 2);
  pMVar11 = p->pMig;
  uVar13 = (pMVar11->vCos).nSize;
  uVar15 = (ulong)uVar13;
  if (0 < (int)uVar13) {
    lVar12 = 0;
    do {
      uVar13 = (uint)uVar15;
      if ((int)uVar13 <= lVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar18 = (pMVar11->vCos).pArray[lVar12];
      if (((int)uVar18 < 0) || (pMVar11->nObjs <= (int)uVar18)) goto LAB_004099e2;
      if ((pMVar11->vPages).nSize <= (int)(uVar18 >> 0xc)) goto LAB_00409a01;
      pvVar1 = (pMVar11->vPages).pArray[uVar18 >> 0xc];
      if (pvVar1 == (void *)0x0) break;
      uVar15 = (ulong)((uVar18 & 0xfff) << 4);
      uVar18 = *(uint *)((long)pvVar1 + uVar15 + 0xc) >> 1;
      uVar13 = *(uint *)((long)pvVar1 + uVar15) >> 1;
      if (uVar18 <= uVar13) {
        __assert_fail("i < 3 && Mig_FanId(p, i) < Mig_ObjId(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                      ,0xaa,"int Mig_ObjFaninId(Mig_Obj_t *, int)");
      }
      lVar16 = *(long *)((long)pvVar1 + (uVar15 - ((uVar18 & 0xfff) << 4)) + -0x10);
      if (*(int *)(lVar16 + 8) <= (int)uVar13) goto LAB_004099e2;
      uVar18 = *(uint *)((long)pvVar1 + uVar15) >> 0xd;
      if (*(int *)(lVar16 + 0x1c) <= (int)uVar18) goto LAB_00409a01;
      uVar13 = *(uint *)(*(long *)(*(long *)(lVar16 + 0x20) + (ulong)uVar18 * 8) + 0xc +
                        (ulong)((uVar13 & 0xfff) << 4)) >> 1;
      if ((p->vMigRefs).nSize <= (int)uVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar2 = (p->vMigRefs).pArray + uVar13;
      *piVar2 = *piVar2 + -1;
      lVar12 = lVar12 + 1;
      uVar13 = (pMVar11->vCos).nSize;
      uVar15 = (ulong)(int)uVar13;
    } while (lVar12 < (long)uVar15);
  }
  uVar18 = 0;
  p->nCutsMerged = 0;
  pMVar11->iPage = 0;
  if (0 < (pMVar11->vPages).nSize) {
    do {
      if ((int)uVar18 < 0) goto LAB_00409a01;
      pMVar22 = (Mig_Obj_t *)(pMVar11->vPages).pArray[uVar18];
      pMVar11->pPage = pMVar22;
      if (pMVar22 == (Mig_Obj_t *)0x0) break;
      if ((uint)pMVar22->pFans[3] < 0xfffffffe) {
        do {
          if ((uint)pMVar22->pFans[1] < 0xfffffffe) {
            Mpm_ManDeriveCuts(p,pMVar22);
          }
          pMVar21 = pMVar22 + 1;
          pMVar22 = pMVar22 + 1;
        } while ((uint)pMVar21->pFans[3] < 0xfffffffe);
        pMVar11 = p->pMig;
      }
      uVar18 = pMVar11->iPage + 1;
      pMVar11->iPage = uVar18;
    } while ((int)uVar18 < (pMVar11->vPages).nSize);
    uVar13 = (pMVar11->vCos).nSize;
  }
  iVar8 = (pMVar11->vCis).nSize;
  if (iVar8 + pMVar11->nObjs + ~(uVar13 + iVar8) != p->pManCuts->nEntries) {
    __assert_fail("Mig_ManCandNum(p->pMig) == p->pManCuts->nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                  ,0x335,"void Mpm_ManPerformRound(Mpm_Man_t *)");
  }
  piVar2 = (p->vMapRefs).pArray;
  piVar3 = (p->vRequireds).pArray;
  p->GloArea = 0;
  p->GloEdge = 0;
  lVar12 = (long)(pMVar11->vCos).nSize;
  if (lVar12 < 1) {
    iVar8 = 0;
  }
  else {
    lVar16 = 0;
    iVar8 = 0;
    do {
      uVar13 = (pMVar11->vCos).pArray[lVar16];
      if (((int)uVar13 < 0) || (pMVar11->nObjs <= (int)uVar13)) goto LAB_004099e2;
      if ((pMVar11->vPages).nSize <= (int)(uVar13 >> 0xc)) goto LAB_00409a01;
      pvVar1 = (pMVar11->vPages).pArray[uVar13 >> 0xc];
      if (pvVar1 == (void *)0x0) break;
      iVar19 = (p->vTimes).pArray[*(uint *)((long)pvVar1 + (ulong)((uVar13 & 0xfff) << 4)) >> 1];
      if (iVar8 <= iVar19) {
        iVar8 = iVar19;
      }
      lVar16 = lVar16 + 1;
    } while (lVar12 != lVar16);
  }
  p->GloRequired = iVar8;
  iVar19 = p->pPars->DelayTarget;
  if (iVar19 != -1) {
    if (iVar19 < iVar8) {
      iVar19 = iVar8;
    }
    p->GloRequired = iVar19;
  }
  uVar13 = pMVar11->nObjs;
  piVar9 = piVar2;
  if ((p->vMapRefs).nCap < (int)uVar13) {
    if (piVar2 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar13 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar2,(long)(int)uVar13 << 2);
    }
    (p->vMapRefs).pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_00409abb;
    (p->vMapRefs).nCap = uVar13;
  }
  if (0 < (int)uVar13) {
    memset(piVar9,0,(ulong)uVar13 * 4);
  }
  (p->vMapRefs).nSize = uVar13;
  uVar13 = p->pMig->nObjs;
  if ((p->vRequireds).nCap < (int)uVar13) {
    piVar9 = (p->vRequireds).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar13 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar13 << 2);
    }
    (p->vRequireds).pArray = piVar9;
    if (piVar9 == (int *)0x0) {
LAB_00409abb:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRequireds).nCap = uVar13;
  }
  auVar7 = _DAT_008403e0;
  if (0 < (int)uVar13) {
    piVar9 = (p->vRequireds).pArray;
    lVar12 = (ulong)uVar13 - 1;
    auVar23._8_4_ = (int)lVar12;
    auVar23._0_8_ = lVar12;
    auVar23._12_4_ = (int)((ulong)lVar12 >> 0x20);
    lVar12 = 0;
    auVar23 = auVar23 ^ _DAT_008403e0;
    auVar24 = _DAT_008403c0;
    auVar25 = _DAT_008403d0;
    do {
      auVar26 = auVar25 ^ auVar7;
      iVar8 = auVar23._4_4_;
      if ((bool)(~(auVar26._4_4_ == iVar8 && auVar23._0_4_ < auVar26._0_4_ || iVar8 < auVar26._4_4_)
                & 1)) {
        *(undefined4 *)((long)piVar9 + lVar12) = 1000000000;
      }
      if ((auVar26._12_4_ != auVar23._12_4_ || auVar26._8_4_ <= auVar23._8_4_) &&
          auVar26._12_4_ <= auVar23._12_4_) {
        *(undefined4 *)((long)piVar9 + lVar12 + 4) = 1000000000;
      }
      auVar26 = auVar24 ^ auVar7;
      iVar19 = auVar26._4_4_;
      if (iVar19 <= iVar8 && (iVar19 != iVar8 || auVar26._0_4_ <= auVar23._0_4_)) {
        *(undefined4 *)((long)piVar9 + lVar12 + 8) = 1000000000;
        *(undefined4 *)((long)piVar9 + lVar12 + 0xc) = 1000000000;
      }
      lVar16 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 4;
      auVar25._8_8_ = lVar16 + 4;
      lVar16 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar16 + 4;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uVar13 + 3 >> 2) << 4 != lVar12);
  }
  (p->vRequireds).nSize = uVar13;
  pMVar11 = p->pMig;
  iVar8 = (pMVar11->vPages).nSize;
  uVar13 = iVar8 - 1;
  pMVar11->iPage = uVar13;
  if (0 < iVar8) {
    do {
      uVar18 = (pMVar11->vPages).nSize;
      if ((int)uVar18 <= (int)uVar13) {
LAB_00409a01:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar4 = (pMVar11->vPages).pArray;
      pMVar22 = (Mig_Obj_t *)ppvVar4[uVar13];
      pMVar11->pPage = pMVar22;
      if (pMVar22 == (Mig_Obj_t *)0x0) break;
      if (uVar13 == uVar18 - 1) {
        if (pMVar11->nObjs < 1) {
LAB_004099e2:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                        ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
        }
        uVar20 = pMVar11->nObjs - 1;
        uVar13 = uVar20 >> 0xc;
        if (uVar18 <= uVar13) goto LAB_00409a01;
        pMVar21 = (Mig_Obj_t *)((ulong)((uVar20 & 0xfff) << 4) + (long)ppvVar4[uVar13]);
      }
      else {
        pMVar21 = pMVar22 + 0xfff;
      }
      lVar12 = (long)pMVar21 - (long)pMVar22;
      while (-1 < lVar12) {
        if ((uint)pMVar21->pFans[1] < 0xfffffffe) {
          uVar13 = (uint)pMVar21->pFans[3] >> 1;
          iVar8 = piVar3[uVar13];
          if (iVar8 < 1) {
            __assert_fail("Required > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                          ,0x2c2,"void Mpm_ManFinalizeRound(Mpm_Man_t *)");
          }
          if (0 < piVar2[uVar13]) {
            pMVar10 = Mpm_ObjCutBestP(p,(Mig_Obj_t *)(ulong)(uint)pMVar21->pFans[3]);
            pMVar5 = p->pLibLut;
            uVar13 = *(uint *)&pMVar10->field_0x4;
            uVar18 = uVar13 >> 0x1b;
            uVar15 = (ulong)uVar18;
            if (0x7ffffff < uVar13) {
              uVar17 = 0;
              do {
                if (pMVar10->pLeaves[uVar17] < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                uVar13 = (uint)pMVar10->pLeaves[uVar17] >> 1;
                iVar19 = iVar8 - pMVar5->pLutDelays[uVar18][uVar17];
                if (piVar3[uVar13] < iVar19) {
                  iVar19 = piVar3[uVar13];
                }
                piVar3[uVar13] = iVar19;
                piVar2[uVar13] = piVar2[uVar13] + 1;
                uVar17 = uVar17 + 1;
                uVar13 = *(uint *)&pMVar10->field_0x4;
                uVar15 = (ulong)(uVar13 >> 0x1b);
              } while (uVar17 < uVar15);
            }
            pMVar6 = p->pPars;
            if (pMVar6->fMap4Cnf == 0) {
              if (pMVar6->fMap4Aig != 0) {
                iVar8 = *(int *)((long)&p->pDsd6->nAnds + (ulong)((uVar13 & 0x1fffffe) << 4));
                goto LAB_00409862;
              }
              iVar8 = 0x14;
              if (pMVar6->fMap4Gates == 0) {
                iVar8 = pMVar5->pLutAreas[uVar15];
              }
            }
            else {
              iVar8 = *(int *)((long)&p->pDsd6->nClauses + (ulong)((uVar13 & 0x1fffffe) << 4));
LAB_00409862:
              iVar8 = iVar8 * 0x14;
            }
            p->GloArea = p->GloArea + (long)iVar8;
            p->GloEdge = p->GloEdge + (ulong)(*(uint *)&pMVar10->field_0x4 >> 0x1b);
            pMVar11 = p->pMig;
          }
        }
        else if (((uint)pMVar21->pFans[2] < 0xfffffffe) &&
                ((uint)pMVar21->pFans[0] >> 1 < 0x7fffffff)) {
          piVar3[(uint)pMVar21->pFans[0] >> 1] = p->GloRequired;
          piVar2[(uint)pMVar21->pFans[0] >> 1] = piVar2[(uint)pMVar21->pFans[0] >> 1] + 1;
        }
        pMVar21 = pMVar21 + -1;
        lVar12 = (long)pMVar21 - (long)pMVar11->pPage;
      }
      pMVar11->iPage = pMVar11->iPage + -1;
      uVar13 = pMVar11->iPage;
    } while (-1 < (int)uVar13);
  }
  uVar15 = p->GloArea / 0x14;
  p->GloArea = uVar15;
  if (p->pPars->fVerbose != 0) {
    if (p->vTtMem == (Vec_Mem_t *)0x0) {
      uVar17 = 0;
    }
    else {
      uVar17 = (ulong)(uint)p->vTtMem->nEntries;
    }
    printf("Del =%5d.  Ar =%8d.  Edge =%8d.  Cut =%10d. Max =%8d.  Tru =%8d. Small =%6d. ",
           (ulong)(uint)p->GloRequired,uVar15,(ulong)(uint)p->GloEdge,(ulong)(uint)p->nCutsMerged,
           (ulong)(uint)p->pManCuts->nEntriesMax,uVar17,(ulong)(uint)p->nSmallSupp);
    iVar19 = 3;
    iVar8 = clock_gettime(3,(timespec *)&ts);
    if (iVar8 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar19,"%s =","Time");
    Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar12 + lVar14) / 1000000.0);
  }
  return;
}

Assistant:

void Mpm_ManPerformRound( Mpm_Man_t * p )
{
    Mig_Obj_t * pObj;
    abctime clk = Abc_Clock();
    int i;
    // copy references
    assert( Vec_IntSize(&p->vMigRefs) == Vec_IntSize(&p->pMig->vRefs) );
    memcpy( Vec_IntArray(&p->vMigRefs), Vec_IntArray(&p->pMig->vRefs), sizeof(int) * Mig_ManObjNum(p->pMig) );
    Mig_ManForEachCo( p->pMig, pObj, i )
        Mig_ObjMigRefDec( p, Mig_ObjFanin0(pObj) );
    // derive cuts
    p->nCutsMerged = 0;
    Mig_ManForEachNode( p->pMig, pObj )
        Mpm_ManDeriveCuts( p, pObj );
    assert( Mig_ManCandNum(p->pMig) == p->pManCuts->nEntries );
    Mpm_ManFinalizeRound( p );
    // report results
    if ( p->pPars->fVerbose )
    {
    printf( "Del =%5d.  Ar =%8d.  Edge =%8d.  Cut =%10d. Max =%8d.  Tru =%8d. Small =%6d. ", 
        p->GloRequired, (int)p->GloArea, (int)p->GloEdge, 
        p->nCutsMerged, p->pManCuts->nEntriesMax, 
        p->vTtMem ? p->vTtMem->nEntries : 0, p->nSmallSupp );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}